

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O0

RGB pbrt::PixelSensor::ProjectReflectance<pbrt::RGB>
              (SpectrumHandle *refl,SpectrumHandle *illum,SpectrumHandle *b1,SpectrumHandle *b2,
              SpectrumHandle *b3)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  Float *pFVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  undefined1 auVar8 [64];
  undefined1 auVar10 [56];
  RGB RVar11;
  Float lambda;
  Float g_integral;
  RGB result;
  float in_stack_ffffffffffffff4c;
  Float in_stack_ffffffffffffff50;
  Float in_stack_ffffffffffffff54;
  float local_4c;
  uint local_48;
  RGB local_44 [5];
  undefined1 auVar9 [64];
  undefined1 extraout_var [60];
  
  RGB::RGB(local_44);
  local_48 = 0;
  for (local_4c = 360.0; local_4c <= 830.0; local_4c = local_4c + 1.0) {
    FVar5 = SpectrumHandle::operator()
                      ((SpectrumHandle *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c);
    auVar8._0_4_ = SpectrumHandle::operator()
                             ((SpectrumHandle *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              in_stack_ffffffffffffff4c);
    auVar8._4_60_ = extraout_var;
    auVar3 = vfmadd213ss_fma(auVar8._0_16_,ZEXT416((uint)FVar5),ZEXT416(local_48));
    local_48 = auVar3._0_4_;
    FVar5 = SpectrumHandle::operator()
                      ((SpectrumHandle *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c);
    FVar6 = SpectrumHandle::operator()
                      ((SpectrumHandle *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c);
    in_stack_ffffffffffffff4c = FVar5 * FVar6;
    FVar5 = SpectrumHandle::operator()
                      ((SpectrumHandle *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c);
    pFVar4 = RGB::operator[](local_44,0);
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)FVar5),ZEXT416((uint)in_stack_ffffffffffffff4c),
                             ZEXT416((uint)*pFVar4));
    *pFVar4 = auVar3._0_4_;
    in_stack_ffffffffffffff50 =
         SpectrumHandle::operator()
                   ((SpectrumHandle *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff4c);
    FVar5 = SpectrumHandle::operator()
                      ((SpectrumHandle *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c);
    fVar2 = in_stack_ffffffffffffff50 * FVar5;
    in_stack_ffffffffffffff54 =
         SpectrumHandle::operator()
                   ((SpectrumHandle *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff4c);
    pFVar4 = RGB::operator[](local_44,1);
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffff54),ZEXT416((uint)fVar2),
                             ZEXT416((uint)*pFVar4));
    *pFVar4 = auVar3._0_4_;
    FVar5 = SpectrumHandle::operator()
                      ((SpectrumHandle *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c);
    FVar6 = SpectrumHandle::operator()
                      ((SpectrumHandle *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c);
    FVar7 = SpectrumHandle::operator()
                      ((SpectrumHandle *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c);
    pFVar4 = RGB::operator[](local_44,2);
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)FVar7),ZEXT416((uint)(FVar5 * FVar6)),
                             ZEXT416((uint)*pFVar4));
    *pFVar4 = auVar3._0_4_;
  }
  auVar10 = (undefined1  [56])0x0;
  RVar11 = RGB::operator/((RGB *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff4c);
  auVar9._0_8_ = RVar11._0_8_;
  auVar9._8_56_ = auVar10;
  uVar1 = vmovlpd_avx(auVar9._0_16_);
  RVar11.b = RVar11.b;
  RVar11.r = (Float)(int)uVar1;
  RVar11.g = (Float)(int)((ulong)uVar1 >> 0x20);
  return RVar11;
}

Assistant:

inline Triplet PixelSensor::ProjectReflectance(SpectrumHandle refl, SpectrumHandle illum,
                                               SpectrumHandle b1, SpectrumHandle b2,
                                               SpectrumHandle b3) {
    Triplet result;
    Float g_integral = 0;
    for (Float lambda = Lambda_min; lambda <= Lambda_max; ++lambda) {
        g_integral += b2(lambda) * illum(lambda);
        result[0] += b1(lambda) * refl(lambda) * illum(lambda);
        result[1] += b2(lambda) * refl(lambda) * illum(lambda);
        result[2] += b3(lambda) * refl(lambda) * illum(lambda);
    }
    return result / g_integral;
}